

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void ot::commissioner::BorderAgentFromJson(BorderAgent *aAgent,json *aJson)

{
  bool bVar1;
  State SVar2;
  const_reference pvVar3;
  JsonException *this;
  allocator local_211;
  key_type local_210;
  undefined1 local_1f0 [40];
  BorderAgent agent;
  Error local_50;
  
  BorderAgent::BorderAgent(&agent);
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[5],_0>(aJson,(char (*) [5])0x1f3b5b);
  if (bVar1) {
    agent.mPresentFlags._0_1_ = (byte)agent.mPresentFlags | 1;
    std::__cxx11::string::string((string *)&local_210,"Addr",&local_211);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&local_210);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,pvVar3
              );
    std::__cxx11::string::operator=((string *)&agent.mAddr,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[5],_0>(aJson,(char (*) [5])0x1f2f2f);
  if (bVar1) {
    agent.mPresentFlags._0_1_ = (byte)agent.mPresentFlags | 2;
    std::__cxx11::string::string((string *)local_1f0,"Port",(allocator *)&local_210);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)local_1f0);
    agent.mPort = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::get<unsigned_short,_unsigned_short,_0>(pvVar3);
    std::__cxx11::string::~string((string *)local_1f0);
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[14],_0>(aJson,(char (*) [14])"ThreadVersion");
  if (bVar1) {
    agent.mPresentFlags._0_1_ = (byte)agent.mPresentFlags | 4;
    std::__cxx11::string::string((string *)&local_210,"ThreadVersion",&local_211);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&local_210);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,pvVar3
              );
    std::__cxx11::string::operator=((string *)&agent.mThreadVersion,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[6],_0>(aJson,(char (*) [6])"State");
  if (bVar1) {
    agent.mPresentFlags._0_1_ = (byte)agent.mPresentFlags | 8;
    std::__cxx11::string::string((string *)local_1f0,"State",(allocator *)&local_210);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)local_1f0);
    SVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<ot::commissioner::BorderAgent::State,_ot::commissioner::BorderAgent::State,_0>
                      (pvVar3);
    agent.mState._0_2_ = SVar2._0_2_;
    std::__cxx11::string::~string((string *)local_1f0);
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[12],_0>(aJson,(char (*) [12])"NetworkName");
  if (bVar1) {
    agent.mPresentFlags._0_1_ = (byte)agent.mPresentFlags | 0x10;
    std::__cxx11::string::string((string *)&local_210,"NetworkName",&local_211);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&local_210);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,pvVar3
              );
    std::__cxx11::string::operator=((string *)&agent.mNetworkName,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[14],_0>(aJson,(char (*) [14])"ExtendedPanId");
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)aJson,"ExtendedPanId");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_210,pvVar3);
    utils::ParseInteger<unsigned_long>((Error *)local_1f0,&agent.mExtendedPanId,&local_210);
    std::__cxx11::string::~string((string *)(local_1f0 + 8));
    std::__cxx11::string::~string((string *)&local_210);
    if (local_1f0._0_4_ != kNone) {
      this = (JsonException *)__cxa_allocate_exception(0x38);
      pvVar3 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)aJson,"ExtendedPanId");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                 pvVar3);
      utils::ParseInteger<unsigned_long>(&local_50,&agent.mExtendedPanId,(string *)local_1f0);
      JsonException::JsonException(this,&local_50);
      __cxa_throw(this,&JsonException::typeinfo,JsonException::~JsonException);
    }
    agent.mPresentFlags._0_1_ = (byte)agent.mPresentFlags | 0x20;
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[11],_0>(aJson,(char (*) [11])"VendorName");
  if (bVar1) {
    agent.mPresentFlags._0_1_ = (byte)agent.mPresentFlags | 0x40;
    std::__cxx11::string::string((string *)&local_210,"VendorName",&local_211);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&local_210);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,pvVar3
              );
    std::__cxx11::string::operator=((string *)&agent.mVendorName,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[10],_0>(aJson,(char (*) [10])"ModelName");
  if (bVar1) {
    agent.mPresentFlags._0_1_ = (byte)agent.mPresentFlags | 0x80;
    std::__cxx11::string::string((string *)&local_210,"ModelName",&local_211);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&local_210);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,pvVar3
              );
    std::__cxx11::string::operator=((string *)&agent.mModelName,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[16],_0>(aJson,(char (*) [16])"ActiveTimestamp");
  if (bVar1) {
    agent.mPresentFlags._1_1_ = agent.mPresentFlags._1_1_ | 1;
    std::__cxx11::string::string((string *)local_1f0,"ActiveTimestamp",(allocator *)&local_210);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)local_1f0);
    agent.mActiveTimestamp =
         nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         ::get<ot::commissioner::Timestamp,_ot::commissioner::Timestamp,_0>(pvVar3);
    std::__cxx11::string::~string((string *)local_1f0);
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[12],_0>(aJson,(char (*) [12])"PartitionId");
  if (bVar1) {
    agent.mPresentFlags._1_1_ = agent.mPresentFlags._1_1_ | 2;
    std::__cxx11::string::string((string *)local_1f0,"PartitionId",(allocator *)&local_210);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)local_1f0);
    agent.mPartitionId =
         nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         ::get<unsigned_int,_unsigned_int,_0>(pvVar3);
    std::__cxx11::string::~string((string *)local_1f0);
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[11],_0>(aJson,(char (*) [11])"VendorData");
  if (bVar1) {
    agent.mPresentFlags._1_1_ = agent.mPresentFlags._1_1_ | 4;
    std::__cxx11::string::string((string *)&local_210,"VendorData",&local_211);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&local_210);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,pvVar3
              );
    std::__cxx11::string::operator=((string *)&agent.mVendorData,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[10],_0>(aJson,(char (*) [10])"VendorOui");
  if (bVar1) {
    agent.mPresentFlags._1_1_ = agent.mPresentFlags._1_1_ | 8;
    std::__cxx11::string::string((string *)local_1f0,"VendorOui",&local_211);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)local_1f0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_0>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_210,pvVar3);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&agent.mVendorOui,&local_210);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_210);
    std::__cxx11::string::~string((string *)local_1f0);
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[11],_0>(aJson,(char (*) [11])"DomainName");
  if (bVar1) {
    agent.mPresentFlags._1_1_ = agent.mPresentFlags._1_1_ | 0x10;
    std::__cxx11::string::string((string *)&local_210,"DomainName",&local_211);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&local_210);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,pvVar3
              );
    std::__cxx11::string::operator=((string *)&agent.mDomainName,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[13],_0>(aJson,(char (*) [13])"BbrSeqNumber");
  if (bVar1) {
    agent.mPresentFlags._1_1_ = agent.mPresentFlags._1_1_ | 0x20;
    std::__cxx11::string::string((string *)local_1f0,"BbrSeqNumber",(allocator *)&local_210);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)local_1f0);
    agent.mBbrSeqNumber =
         nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         ::get<unsigned_char,_unsigned_char,_0>(pvVar3);
    std::__cxx11::string::~string((string *)local_1f0);
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[8],_0>(aJson,(char (*) [8])"BbrPort");
  if (bVar1) {
    agent.mPresentFlags._1_1_ = agent.mPresentFlags._1_1_ | 0x40;
    std::__cxx11::string::string((string *)local_1f0,"BbrPort",(allocator *)&local_210);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)local_1f0);
    agent.mBbrPort =
         nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         ::get<unsigned_short,_unsigned_short,_0>(pvVar3);
    std::__cxx11::string::~string((string *)local_1f0);
  }
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[12],_0>(aJson,(char (*) [12])"ServiceName");
  if (bVar1) {
    agent.mPresentFlags._2_1_ = agent.mPresentFlags._2_1_ | 1;
    std::__cxx11::string::string((string *)&local_210,"ServiceName",&local_211);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&local_210);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,pvVar3
              );
    std::__cxx11::string::operator=((string *)&agent.mServiceName,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
  }
  BorderAgent::operator=(aAgent,&agent);
  BorderAgent::~BorderAgent(&agent);
  return;
}

Assistant:

void BorderAgentFromJson(BorderAgent &aAgent, const nlohmann::json &aJson)
{
    BorderAgent agent;

#define SET_IF_PRESENT(field)                                                  \
    do                                                                         \
    {                                                                          \
        if (aJson.contains(#field))                                            \
        {                                                                      \
            agent.mPresentFlags |= BorderAgent::k##field##Bit;                 \
            agent.m##field = aJson.at(#field).get<decltype(agent.m##field)>(); \
        }                                                                      \
    } while (false)

    SET_IF_PRESENT(Addr);
    SET_IF_PRESENT(Port);
    SET_IF_PRESENT(ThreadVersion);
    SET_IF_PRESENT(State);
    SET_IF_PRESENT(NetworkName);

    if (aJson.contains("ExtendedPanId"))
    {
        SuccessOrThrow(utils::ParseInteger(agent.mExtendedPanId, aJson["ExtendedPanId"]));
        agent.mPresentFlags |= BorderAgent::kExtendedPanIdBit;
    }

    SET_IF_PRESENT(VendorName);
    SET_IF_PRESENT(ModelName);
    SET_IF_PRESENT(ActiveTimestamp);
    SET_IF_PRESENT(PartitionId);
    SET_IF_PRESENT(VendorData);
    SET_IF_PRESENT(VendorOui);
    SET_IF_PRESENT(DomainName);
    SET_IF_PRESENT(BbrSeqNumber);
    SET_IF_PRESENT(BbrPort);
    SET_IF_PRESENT(ServiceName);

#undef SET_IF_PRESENT

    aAgent = agent;
}